

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_init(char *argv0)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  PHYSFS_ErrorCode errcode;
  size_t sVar4;
  char *argv0_local;
  
  if (initialized == 0) {
    if (externalAllocator == 0) {
      setDefaultAllocator();
    }
    if ((__PHYSFS_AllocatorHooks.Init == (_func_int *)0x0) ||
       (iVar3 = (*__PHYSFS_AllocatorHooks.Init)(), iVar3 != 0)) {
      iVar3 = __PHYSFS_platformInit();
      if (iVar3 == 0) {
        if (__PHYSFS_AllocatorHooks.Deinit != (_func_void *)0x0) {
          (*__PHYSFS_AllocatorHooks.Deinit)();
        }
      }
      else {
        iVar3 = initializeMutexes();
        if (((iVar3 != 0) && (baseDir = calculateBaseDir(argv0), baseDir != (char *)0x0)) &&
           (userDir = __PHYSFS_platformCalcUserDir(), pcVar1 = baseDir, userDir != (char *)0x0)) {
          sVar4 = strlen(baseDir);
          pcVar2 = userDir;
          if (pcVar1[sVar4 - 1] != '/') {
            __assert_fail("baseDir[strlen(baseDir) - 1] == __PHYSFS_platformDirSeparator",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                          ,0x4be,"int PHYSFS_init(const char *)");
          }
          sVar4 = strlen(userDir);
          if (pcVar2[sVar4 - 1] != '/') {
            __assert_fail("userDir[strlen(userDir) - 1] == __PHYSFS_platformDirSeparator",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                          ,0x4bf,"int PHYSFS_init(const char *)");
          }
          iVar3 = initStaticArchivers();
          if (iVar3 != 0) {
            initialized = 1;
            errcode = PHYSFS_getLastErrorCode();
            PHYSFS_setErrorCode(errcode);
            return 1;
          }
        }
        doDeinit();
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_IS_INITIALIZED);
  }
  return 0;
}

Assistant:

int PHYSFS_init(const char *argv0)
{
    BAIL_IF(initialized, PHYSFS_ERR_IS_INITIALIZED, 0);

    if (!externalAllocator)
        setDefaultAllocator();

    if ((allocator.Init != NULL) && (!allocator.Init())) return 0;

    if (!__PHYSFS_platformInit())
    {
        if (allocator.Deinit != NULL) allocator.Deinit();
        return 0;
    } /* if */

    /* everything below here can be cleaned up safely by doDeinit(). */

    if (!initializeMutexes()) goto initFailed;

    baseDir = calculateBaseDir(argv0);
    if (!baseDir) goto initFailed;

    userDir = __PHYSFS_platformCalcUserDir();
    if (!userDir) goto initFailed;

    /* Platform layer is required to append a dirsep. */
    assert(baseDir[strlen(baseDir) - 1] == __PHYSFS_platformDirSeparator);
    assert(userDir[strlen(userDir) - 1] == __PHYSFS_platformDirSeparator);

    if (!initStaticArchivers()) goto initFailed;

    initialized = 1;

    /* This makes sure that the error subsystem is initialized. */
    PHYSFS_setErrorCode(PHYSFS_getLastErrorCode());

    return 1;

initFailed:
    doDeinit();
    return 0;
}